

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O2

void lj_buf_shrink(lua_State *L,SBuf *sb)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  void *pvVar4;
  uint osz;
  
  uVar1 = (sb->b).ptr32;
  osz = (sb->e).ptr32 - uVar1;
  if (0x40 < osz) {
    uVar2 = (sb->p).ptr32;
    pvVar4 = lj_mem_realloc(L,(void *)(ulong)uVar1,osz,osz >> 1);
    uVar3 = (uint32_t)pvVar4;
    (sb->b).ptr32 = uVar3;
    (sb->p).ptr32 = (uVar2 - uVar1) + uVar3;
    (sb->e).ptr32 = (osz >> 1) + uVar3;
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_buf_shrink(lua_State *L, SBuf *sb)
{
  char *b = sbufB(sb);
  MSize osz = (MSize)(sbufE(sb) - b);
  if (osz > 2*LJ_MIN_SBUF) {
    MSize n = (MSize)(sbufP(sb) - b);
    b = lj_mem_realloc(L, b, osz, (osz >> 1));
    setmref(sb->b, b);
    setmref(sb->p, b + n);
    setmref(sb->e, b + (osz >> 1));
  }
}